

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall
CLI::BadNameString::BadNameString
          (BadNameString *this,string *BadNameString,string *msg,ExitCodes exit_code)

{
  string sStack_68;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_48,(string *)BadNameString);
  ::std::__cxx11::string::string((string *)&sStack_68,(string *)msg);
  ConstructionError::ConstructionError
            (&this->super_ConstructionError,&local_48,&sStack_68,exit_code);
  ::std::__cxx11::string::~string((string *)&sStack_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_ConstructionError).super_Error = &PTR__Error_00147cc0;
  return;
}

Assistant:

static BadNameString OneCharName(std::string name) { return BadNameString("Invalid one char name: " + name); }